

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::visit(Executor *this,AssignmentNode *node)

{
  string *psVar1;
  Value *value;
  reference_wrapper<RuntimeSymbol> *prVar2;
  RuntimeSymbol *pRVar3;
  element_type *peVar4;
  pointer pVVar5;
  double *pdVar6;
  shared_ptr<ExpressionNode> *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  optional<double> *__args;
  AssignmentOperator *pAVar8;
  ValueChanger *this_00;
  Executor *this_01;
  AssignmentNode *in_RSI;
  Executor *in_RDI;
  optional<std::reference_wrapper<RuntimeSymbol>_> oVar9;
  ValueChanger valueChanger_1;
  double newValue;
  double rhs;
  double oldValue;
  NumberValueAnalyser valueAnalyser;
  Executor executor;
  RuntimeVariableAnalyser analyser;
  ValueChanger valueChanger;
  optional<std::reference_wrapper<RuntimeSymbol>_> symbol;
  string name;
  shared_ptr<ExpressionNode> *in_stack_fffffffffffffb78;
  RuntimeVariableAnalyser *in_stack_fffffffffffffb80;
  shared_ptr<ExpressionNode> *in_stack_fffffffffffffb88;
  ValueChanger *in_stack_fffffffffffffb90;
  Context *in_stack_fffffffffffffba8;
  Executor *in_stack_fffffffffffffbb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  undefined8 in_stack_fffffffffffffbd0;
  int maxDepth;
  string *in_stack_fffffffffffffbd8;
  Context *in_stack_fffffffffffffbe0;
  Node *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  TypeName *in_stack_fffffffffffffc30;
  shared_ptr<ExpressionNode> local_390;
  undefined1 local_380 [24];
  double local_368;
  double local_360;
  string local_358 [36];
  undefined4 local_334;
  double local_330;
  string local_328 [36];
  undefined4 local_304;
  NumberValueAnalyser local_300;
  Executor local_2e0;
  RuntimeVariableAnalyser local_b0;
  undefined1 local_68 [40];
  _Storage<std::reference_wrapper<RuntimeSymbol>,_true> local_40;
  undefined1 local_38;
  string local_30 [32];
  AssignmentNode *local_10;
  
  maxDepth = (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20);
  local_10 = in_RSI;
  psVar1 = AssignmentNode::getName_abi_cxx11_(in_RSI);
  std::__cxx11::string::string(local_30,(string *)psVar1);
  oVar9 = Context::lookup(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,maxDepth);
  local_40 = oVar9.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>.
             _M_payload.super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>.
             _M_payload;
  local_38 = oVar9.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>.
             _M_payload.super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>.
             _M_engaged;
  value = (Value *)AssignmentNode::getOperation(local_10);
  if (*(int *)&value->_vptr_Value == 0) {
    AssignmentNode::getValue(local_10);
    std::shared_ptr<ExpressionNode>::shared_ptr
              ((shared_ptr<ExpressionNode> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    ValueChanger::ValueChanger(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    std::shared_ptr<ExpressionNode>::~shared_ptr((shared_ptr<ExpressionNode> *)0x188a26);
    prVar2 = std::optional<std::reference_wrapper<RuntimeSymbol>_>::value
                       ((optional<std::reference_wrapper<RuntimeSymbol>_> *)
                        in_stack_fffffffffffffb80);
    pRVar3 = std::reference_wrapper<RuntimeSymbol>::get(prVar2);
    (*pRVar3->_vptr_RuntimeSymbol[2])(pRVar3,local_68);
    ValueChanger::~ValueChanger((ValueChanger *)in_stack_fffffffffffffb80);
  }
  else {
    RuntimeVariableAnalyser::RuntimeVariableAnalyser(in_stack_fffffffffffffb80);
    prVar2 = std::optional<std::reference_wrapper<RuntimeSymbol>_>::value
                       ((optional<std::reference_wrapper<RuntimeSymbol>_> *)
                        in_stack_fffffffffffffb80);
    pRVar3 = std::reference_wrapper<RuntimeSymbol>::get(prVar2);
    (*pRVar3->_vptr_RuntimeSymbol[2])(pRVar3,&local_b0);
    RuntimeVariableAnalyser::getContext((RuntimeVariableAnalyser *)0x188b2d);
    Executor(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    RuntimeVariableAnalyser::getValue(&local_b0);
    peVar4 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x188b72);
    (*(peVar4->super_Node)._vptr_Node[2])(peVar4,&local_2e0);
    NumberValueAnalyser::NumberValueAnalyser((NumberValueAnalyser *)in_stack_fffffffffffffb80);
    getValue(&local_2e0);
    std::unique_ptr<Value,_std::default_delete<Value>_>::operator*
              ((unique_ptr<Value,_std::default_delete<Value>_> *)in_stack_fffffffffffffb80);
    local_304 = 0;
    AssignmentNode::getOperation(local_10);
    std::
    unordered_map<AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<AssignmentOperator>,_std::equal_to<AssignmentOperator>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at((unordered_map<AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<AssignmentOperator>,_std::equal_to<AssignmentOperator>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    std::operator+(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    assertValueType(in_RDI,value,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                    in_stack_fffffffffffffc20);
    std::__cxx11::string::~string(local_328);
    getValue(&local_2e0);
    pVVar5 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                       ((unique_ptr<Value,_std::default_delete<Value>_> *)0x188c71);
    (*pVVar5->_vptr_Value[3])(pVVar5,&local_300);
    NumberValueAnalyser::getValue(&local_300);
    pdVar6 = std::optional<double>::value((optional<double> *)in_stack_fffffffffffffb80);
    local_330 = *pdVar6;
    psVar7 = AssignmentNode::getValue(local_10);
    peVar4 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x188cdc);
    (*(peVar4->super_Node)._vptr_Node[2])(peVar4,in_RDI);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::unique_ptr<Value,_std::default_delete<Value>_>::operator*
                      ((unique_ptr<Value,_std::default_delete<Value>_> *)in_stack_fffffffffffffb80);
    local_334 = 0;
    AssignmentNode::getOperation(local_10);
    std::
    unordered_map<AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<AssignmentOperator>,_std::equal_to<AssignmentOperator>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at((unordered_map<AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<AssignmentOperator>,_std::equal_to<AssignmentOperator>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    std::operator+((char *)psVar7,__rhs);
    assertValueType(in_RDI,value,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                    in_stack_fffffffffffffc20);
    std::__cxx11::string::~string(local_358);
    pVVar5 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                       ((unique_ptr<Value,_std::default_delete<Value>_> *)0x188da6);
    (*pVVar5->_vptr_Value[3])(pVVar5,&local_300);
    __args = NumberValueAnalyser::getValue(&local_300);
    pdVar6 = std::optional<double>::value((optional<double> *)in_stack_fffffffffffffb80);
    local_360 = *pdVar6;
    local_368 = local_330;
    pAVar8 = AssignmentNode::getOperation(local_10);
    this_00 = (ValueChanger *)(ulong)*pAVar8;
    switch(this_00) {
    case (ValueChanger *)0x0:
      break;
    case (ValueChanger *)0x1:
      local_368 = local_330 + local_360;
      break;
    case (ValueChanger *)0x2:
      local_368 = local_330 - local_360;
      break;
    case (ValueChanger *)0x3:
      local_368 = local_330 * local_360;
      break;
    case (ValueChanger *)0x4:
      local_368 = local_330 / local_360;
      break;
    case (ValueChanger *)0x5:
      local_368 = (double)((uint)(long)local_330 & (uint)(long)local_360);
      break;
    case (ValueChanger *)0x6:
      local_368 = (double)((uint)(long)local_330 | (uint)(long)local_360);
      break;
    case (ValueChanger *)0x7:
      local_368 = (double)((uint)(long)local_330 ^ (uint)(long)local_360);
      break;
    case (ValueChanger *)0x8:
      local_368 = (double)(uint)((int)(long)local_330 << ((byte)(long)local_360 & 0x1f));
      break;
    case (ValueChanger *)0x9:
      local_368 = (double)((uint)(long)local_330 >> ((byte)(long)local_360 & 0x1f));
    }
    std::make_shared<NumericLiteralNode,double&>((double *)__args);
    psVar7 = &local_390;
    std::shared_ptr<ExpressionNode>::shared_ptr<NumericLiteralNode,void>
              ((shared_ptr<ExpressionNode> *)in_stack_fffffffffffffb80,
               (shared_ptr<NumericLiteralNode> *)in_stack_fffffffffffffb78);
    ValueChanger::ValueChanger(this_00,psVar7);
    std::shared_ptr<ExpressionNode>::~shared_ptr((shared_ptr<ExpressionNode> *)0x189070);
    std::shared_ptr<NumericLiteralNode>::~shared_ptr((shared_ptr<NumericLiteralNode> *)0x18907d);
    this_01 = (Executor *)
              std::optional<std::reference_wrapper<RuntimeSymbol>_>::value
                        ((optional<std::reference_wrapper<RuntimeSymbol>_> *)
                         in_stack_fffffffffffffb80);
    pRVar3 = std::reference_wrapper<RuntimeSymbol>::get((reference_wrapper<RuntimeSymbol> *)this_01)
    ;
    (*pRVar3->_vptr_RuntimeSymbol[2])(pRVar3,local_380);
    ValueChanger::~ValueChanger((ValueChanger *)this_01);
    NumberValueAnalyser::~NumberValueAnalyser((NumberValueAnalyser *)0x1890cb);
    ~Executor(this_01);
    RuntimeVariableAnalyser::~RuntimeVariableAnalyser((RuntimeVariableAnalyser *)this_01);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Executor::visit(const AssignmentNode& node)
{
  const auto name = node.getName();
  auto symbol = context_.lookup(name);
  if(node.getOperation() == AssignmentOperator::Assign)
  {
    ValueChanger valueChanger{node.getValue()};
    symbol.value().get().accept(valueChanger);
  }
  else
  {
    RuntimeVariableAnalyser analyser{};
    symbol.value().get().accept(analyser);
    Executor executor{analyser.getContext()};
    analyser.getValue()->accept(executor);

    NumberValueAnalyser valueAnalyser{};

    assertValueType(*executor.getValue(), TypeName::F32,
                    "assignment operation " + AssignmentOperationNames.at(node.getOperation()), node);

    executor.getValue()->accept(valueAnalyser);
    const auto oldValue = valueAnalyser.getValue().value();

    node.getValue()->accept(*this);

    assertValueType(*value_, TypeName::F32,
      "assignment operation " + AssignmentOperationNames.at(node.getOperation()), node);

    value_->accept(valueAnalyser);
    const auto rhs = valueAnalyser.getValue().value();

    double newValue = oldValue;
    switch(node.getOperation())
    {
      case AssignmentOperator::PlusEq:
        newValue = oldValue + rhs;
        break;
      case AssignmentOperator::MinusEq:
        newValue = oldValue - rhs;
        break;
      case AssignmentOperator::MulEq:
        newValue = oldValue * rhs;
        break;
      case AssignmentOperator::DivEq:
        newValue = oldValue / rhs;
        break;
      case AssignmentOperator::OrEq:
        newValue = static_cast<unsigned int>(oldValue) | static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::AndEq:
        newValue = static_cast<unsigned int>(oldValue) & static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::XorEq:
        newValue = static_cast<unsigned int>(oldValue) ^ static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::ShiftLeftEq:
        newValue = static_cast<unsigned int>(oldValue) << static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::ShiftRightEq:
        newValue = static_cast<unsigned int>(oldValue) >> static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::Assign:
        break; // Unreachable
    }

    ValueChanger valueChanger{std::make_shared<NumericLiteralNode>(newValue)};
    symbol.value().get().accept(valueChanger);
  }
}